

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

void __thiscall JSONNode::merge(JSONNode *this,JSONNode *other)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  internalJSONNode *piVar3;
  json_string local_40;
  
  piVar3 = this->internal;
  paVar2 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"no internal","");
  JSONDebug::_JSON_ASSERT(piVar3 != (internalJSONNode *)0x0,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (this->internal != other->internal) {
    local_40.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
    local_40.field_2._7_4_ = 0x6c616e72;
    local_40._M_string_length = 0xb;
    local_40.field_2._M_local_buf[0xb] = '\0';
    local_40._M_dataplus._M_p = (pointer)paVar2;
    JSONDebug::_JSON_ASSERT(other->internal != (internalJSONNode *)0x0,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if (other->internal != this->internal) {
      decRef(other);
      piVar3 = this->internal;
      psVar1 = &piVar3->refcount;
      *psVar1 = *psVar1 + 1;
      other->internal = piVar3;
    }
  }
  return;
}

Assistant:

void JSONNode::merge(JSONNode * other) json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (internal == other -> internal) return;
	   *other = *this;
    }